

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool __thiscall SQVM::DeleteSlot(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *res)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  bool bVar4;
  int iVar5;
  SQChar *pSVar6;
  SQMetaMethod mm;
  byte unaff_BPL;
  byte bVar7;
  SQObjectPtr t;
  SQObjectPtr closure;
  SQObjectPtr local_58;
  SQObjectPtr local_48;
  SQObjectPtr local_38;
  
  SVar2 = (self->super_SQObject)._type;
  if (((SVar2 != OT_TABLE) && (SVar2 != OT_INSTANCE)) && (SVar2 != OT_USERDATA)) {
    pSVar6 = GetTypeName(self);
    bVar7 = 0;
    Raise_Error(this,"attempt to delete a slot from a %s",pSVar6);
    goto LAB_0012f0ed;
  }
  local_58.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_58.super_SQObject._type = OT_NULL;
  local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_38.super_SQObject._type = OT_NULL;
  pSVar3 = (self->super_SQObject)._unVal.pTable;
  if (((pSVar3->super_SQDelegable)._delegate == (SQTable *)0x0) ||
     (iVar5 = (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                _vptr_SQRefCounted[6])(pSVar3,this,0xe,&local_38), (char)iVar5 == '\0')) {
    if ((self->super_SQObject)._type == OT_TABLE) {
      bVar4 = SQTable::Get((self->super_SQObject)._unVal.pTable,key,&local_58);
      if (!bVar4) {
        local_48.super_SQObject._type = (key->super_SQObject)._type;
        local_48.super_SQObject._unVal = (SQObjectValue)(key->super_SQObject)._unVal.pTable;
        if ((local_48.super_SQObject._type >> 0x1b & 1) != 0) {
          pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        Raise_IdxError(this,&local_48);
        SQObjectPtr::~SQObjectPtr(&local_48);
        unaff_BPL = false;
        goto LAB_0012f0d6;
      }
      SQTable::Remove((self->super_SQObject)._unVal.pTable,key);
      SVar2 = (res->super_SQObject)._type;
      pSVar3 = (res->super_SQObject)._unVal.pTable;
      (res->super_SQObject)._unVal = local_58.super_SQObject._unVal;
      (res->super_SQObject)._type = local_58.super_SQObject._type;
      if ((local_58.super_SQObject._type >> 0x1b & 1) != 0) {
        pSVar1 = &(((res->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      bVar7 = 1;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
    }
    else {
      pSVar6 = GetTypeName(self);
      unaff_BPL = 0;
      Raise_Error(this,"cannot delete a slot from %s",pSVar6);
      bVar7 = 0;
    }
  }
  else {
    Push(this,self);
    Push(this,key);
    unaff_BPL = CallMetaMethod(this,&local_38,mm,2,res);
LAB_0012f0d6:
    bVar7 = 0;
  }
  bVar7 = unaff_BPL | bVar7;
  SQObjectPtr::~SQObjectPtr(&local_38);
  SQObjectPtr::~SQObjectPtr(&local_58);
LAB_0012f0ed:
  return (bool)(bVar7 & 1);
}

Assistant:

bool SQVM::DeleteSlot(const SQObjectPtr &self,const SQObjectPtr &key,SQObjectPtr &res)
{
    switch(sq_type(self)) {
    case OT_TABLE:
    case OT_INSTANCE:
    case OT_USERDATA: {
        SQObjectPtr t;
        //bool handled = false;
        SQObjectPtr closure;
        if(_delegable(self)->_delegate && _delegable(self)->GetMetaMethod(this,MT_DELSLOT,closure)) {
            Push(self);Push(key);
            return CallMetaMethod(closure,MT_DELSLOT,2,res);
        }
        else {
            if(sq_type(self) == OT_TABLE) {
                if(_table(self)->Get(key,t)) {
                    _table(self)->Remove(key);
                }
                else {
                    Raise_IdxError((const SQObject &)key);
                    return false;
                }
            }
            else {
                Raise_Error(_SC("cannot delete a slot from %s"),GetTypeName(self));
                return false;
            }
        }
        res = t;
                }
        break;
    default:
        Raise_Error(_SC("attempt to delete a slot from a %s"),GetTypeName(self));
        return false;
    }
    return true;
}